

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall
Database::Connect(Database *this,Engine type,string *host,unsigned_short port,string *user,
                 string *pass,string *db)

{
  _Head_base<0UL,_Database::impl__*,_false> _Var1;
  int iVar2;
  impl_ iVar3;
  anon_union_8_2_1ccce1b9_for_impl__0 aVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  undefined6 in_register_0000000a;
  char *pcVar7;
  
  this->engine = type;
  std::__cxx11::string::_M_assign((string *)&this->host);
  std::__cxx11::string::_M_assign((string *)&this->user);
  std::__cxx11::string::_M_assign((string *)&this->pass);
  this->port = (uint)CONCAT62(in_register_0000000a,port);
  std::__cxx11::string::_M_assign((string *)&this->db);
  if (this->connected != false) {
    return;
  }
  if (type == SQLite) {
    iVar2 = sqlite3_libversion_number();
    if (iVar2 != 0x2e574a) {
      Console::Err(
                  "SQLite library version mismatch! Please recompile EOSERV with the correct SQLite library."
                  );
      Console::Err("  Expected version: %s","3.37.2");
      uVar6 = sqlite3_libversion();
      Console::Err("  Library version:  %s",uVar6);
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      pcVar7 = "SQLite library version mismatch";
      goto LAB_00130165;
    }
    iVar2 = sqlite3_open((host->_M_dataplus)._M_p,
                         (this->impl)._M_t.
                         super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                         .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl);
    if (iVar2 == 0) {
      this->connected = true;
      return;
    }
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    uVar6 = sqlite3_errmsg(((this->impl)._M_t.
                            super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                            .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0)
    ;
  }
  else {
    if (type != MySQL) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      pcVar7 = "Invalid database engine.";
LAB_00130165:
      puVar5[1] = pcVar7;
      *puVar5 = &PTR__exception_001d14e8;
      __cxa_throw(puVar5,&Database_OpenFailed::typeinfo,std::exception::~exception);
    }
    iVar3.field_0 = (anon_union_8_2_1ccce1b9_for_impl__0)mysql_init(0);
    ((this->impl)._M_t.super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
     ._M_t.super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>.
     super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0 = iVar3.field_0;
    if (iVar3.field_0 == (MYSQL *)0x0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
      uVar6 = mysql_error(((this->impl)._M_t.
                           super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                           .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0);
    }
    else {
      aVar4.mysql_handle =
           (MYSQL *)mysql_real_connect(((this->impl)._M_t.
                                        super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                        .super__Head_base<0UL,_Database::impl__*,_false>.
                                       _M_head_impl)->field_0,(host->_M_dataplus)._M_p,
                                       (user->_M_dataplus)._M_p,(pass->_M_dataplus)._M_p,0,
                                       this->port,0,0);
      _Var1._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>._M_t.
           super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>.
           super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl;
      if ((anon_union_8_2_1ccce1b9_for_impl__0)aVar4.mysql_handle == (_Var1._M_head_impl)->field_0)
      {
        this->connected = true;
        iVar2 = mysql_select_db((_Var1._M_head_impl)->field_0,(db->_M_dataplus)._M_p);
        if (iVar2 == 0) {
          return;
        }
        Close(this);
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        uVar6 = mysql_error(((this->impl)._M_t.
                             super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                             .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0
                           );
      }
      else {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        uVar6 = mysql_error(((this->impl)._M_t.
                             super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                             .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0
                           );
      }
    }
  }
  puVar5[1] = uVar6;
  *puVar5 = &PTR__exception_001d14e8;
  __cxa_throw(puVar5,&Database_OpenFailed::typeinfo,std::exception::~exception);
}

Assistant:

void Database::Connect(Database::Engine type, const std::string& host, unsigned short port, const std::string& user, const std::string& pass, const std::string& db)
{
	this->engine = type;
	this->host = host;
	this->user = user;
	this->pass = pass;
	this->port = port;
	this->db = db;

	if (this->connected)
	{
		return;
	}

	switch (type)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
			if ((this->impl->mysql_handle = mysql_init(0)) == 0)
			{
				throw Database_OpenFailed(mysql_error(this->impl->mysql_handle));
			}

// Linux uses the ABI version number as part of the shared library name
#ifdef WIN32
			if (mysql_get_client_version() != MYSQL_VERSION_ID)
			{
				unsigned int client_version = mysql_get_client_version();

				Console::Err("MySQL client library version mismatch! Please recompile EOSERV with the correct MySQL client library.");
				Console::Err("  Expected version: %i.%i.%i", (MYSQL_VERSION_ID) / 10000, ((MYSQL_VERSION_ID) / 100) % 100, (MYSQL_VERSION_ID) % 100);
				Console::Err("  Library version:  %i.%i.%i", (client_version) / 10000, ((client_version) / 100) % 100, (client_version) % 100);
				Console::Err("Make sure EOSERV is using the correct version of libmariadb.dll");
				throw Database_OpenFailed("MySQL client library version mismatch");
			}
#endif

			if (mysql_real_connect(this->impl->mysql_handle, host.c_str(), user.c_str(), pass.c_str(), 0, this->port, 0, 0) != this->impl->mysql_handle)
			{
				throw Database_OpenFailed(mysql_error(this->impl->mysql_handle));
			}

// This check isn't really neccessary for EOSERV
#if 0
			if ((mysql_get_server_version(this->impl->mysql_handle) / 100) != (MYSQL_VERSION_ID) / 100)
			{
				Console::Wrn("MySQL server version mismatch.");
				Console::Wrn("  Server version: %s", mysql_get_server_info(this->impl->mysql_handle));
				Console::Wrn("  Client version: %s", mysql_get_client_info());
			}
#endif

			this->connected = true;

			if (mysql_select_db(this->impl->mysql_handle, db.c_str()) != 0)
			{
				this->Close();
				throw Database_OpenFailed(mysql_error(this->impl->mysql_handle));
			}

			break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			if (sqlite3_libversion_number() != SQLITE_VERSION_NUMBER)
			{
				Console::Err("SQLite library version mismatch! Please recompile EOSERV with the correct SQLite library.");
				Console::Err("  Expected version: %s", SQLITE_VERSION);
				Console::Err("  Library version:  %s", sqlite3_libversion());
#ifdef WIN32
				Console::Err("Make sure EOSERV is using the correct version of sqlite3.dll");
#endif // WIN32
				throw Database_OpenFailed("SQLite library version mismatch");
			}

			if (sqlite3_open(host.c_str(), &this->impl->sqlite_handle) != SQLITE_OK)
			{
				throw Database_OpenFailed(sqlite3_errmsg(this->impl->sqlite_handle));
			}

			this->connected = true;

			break;
#endif // DATABASE_SQLITE

		default:
			throw Database_OpenFailed("Invalid database engine.");
	}
}